

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O0

void __thiscall FuncInfo::ReleaseInnerScopeIndex(FuncInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_14;
  uint index;
  FuncInfo *this_local;
  
  local_14 = this->currentInnerScopeIndex;
  if (local_14 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0x21f,"(index != (uint)-1)","index != (uint)-1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (local_14 == 0) {
    local_14 = 0xffffffff;
  }
  else {
    local_14 = local_14 - 1;
  }
  this->currentInnerScopeIndex = local_14;
  return;
}

Assistant:

void FuncInfo::ReleaseInnerScopeIndex()
{
    uint index = this->currentInnerScopeIndex;
    Assert(index != (uint)-1);

    if (index == 0)
    {
        index = (uint)-1;
    }
    else
    {
        index--;
    }
    this->currentInnerScopeIndex = index;
}